

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cepstrum_to_autocorrelation.cc
# Opt level: O0

void __thiscall
sptk::CepstrumToAutocorrelation::CepstrumToAutocorrelation
          (CepstrumToAutocorrelation *this,int num_input_order,int num_output_order,int fft_length)

{
  bool bVar1;
  int in_ECX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  undefined8 *in_RDI;
  int in_stack_ffffffffffffffbc;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  
  *in_RDI = &PTR__CepstrumToAutocorrelation_00128c68;
  *(undefined4 *)(in_RDI + 1) = in_ESI;
  *(undefined4 *)((long)in_RDI + 0xc) = in_EDX;
  RealValuedFastFourierTransform::RealValuedFastFourierTransform
            ((RealValuedFastFourierTransform *)
             CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffbc
            );
  *(undefined1 *)(in_RDI + 0xf) = 1;
  if ((((*(int *)(in_RDI + 1) < 0) || (*(int *)((long)in_RDI + 0xc) < 0)) ||
      (in_ECX <= *(int *)(in_RDI + 1))) ||
     ((in_ECX <= *(int *)((long)in_RDI + 0xc) ||
      (bVar1 = RealValuedFastFourierTransform::IsValid
                         ((RealValuedFastFourierTransform *)(in_RDI + 2)), !bVar1)))) {
    *(undefined1 *)(in_RDI + 0xf) = 0;
  }
  return;
}

Assistant:

CepstrumToAutocorrelation::CepstrumToAutocorrelation(int num_input_order,
                                                     int num_output_order,
                                                     int fft_length)
    : num_input_order_(num_input_order),
      num_output_order_(num_output_order),
      fast_fourier_transform_(fft_length),
      is_valid_(true) {
  if (num_input_order_ < 0 || num_output_order_ < 0 ||
      fft_length <= num_input_order_ || fft_length <= num_output_order_ ||
      !fast_fourier_transform_.IsValid()) {
    is_valid_ = false;
    return;
  }
}